

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-random.c
# Opt level: O3

void random_cb(uv_random_t *req,int status,void *buf,size_t buflen)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  long *plVar4;
  int64_t eval_b;
  int64_t eval_a;
  char zero [256];
  long lStack_340;
  long lStack_338;
  long alStack_330 [32];
  undefined1 auStack_230 [256];
  code *pcStack_130;
  long local_128;
  size_t local_120;
  undefined1 local_118 [256];
  
  pcStack_130 = (code *)0x1b8211;
  memset(local_118,0,0x100);
  iVar2 = random_cb_called;
  local_120 = (size_t)status;
  local_128 = 0;
  if (local_120 == 0) {
    if ((char *)buf != scratch) goto LAB_001b830c;
    if (random_cb_called != 0) {
      local_128 = 0x100;
      local_120 = buflen;
      if (buflen == 0x100) {
        local_120 = 0;
        pcStack_130 = (code *)0x1b8285;
        iVar1 = memcmp(scratch,local_118,0x100);
        local_128 = (long)iVar1;
        if (local_120 != local_128) goto LAB_001b82eb;
        pcStack_130 = (code *)0x1b82a3;
        random_cb_cold_4();
        goto LAB_001b82a3;
      }
      goto LAB_001b8314;
    }
LAB_001b82a3:
    local_128 = 0;
    local_120 = buflen;
    if (buflen != 0) goto LAB_001b8321;
    pcStack_130 = (code *)0x1b82d1;
    iVar1 = memcmp(scratch,local_118,0x100);
    local_120 = (size_t)iVar1;
    local_128 = 0;
    if (local_120 == 0) {
LAB_001b82eb:
      random_cb_called = iVar2 + 1;
      return;
    }
  }
  else {
    pcStack_130 = (code *)0x1b830c;
    random_cb_cold_1();
LAB_001b830c:
    pcStack_130 = (code *)0x1b8314;
    random_cb_cold_2();
LAB_001b8314:
    pcStack_130 = (code *)0x1b8321;
    random_cb_cold_3();
LAB_001b8321:
    pcStack_130 = (code *)0x1b832e;
    random_cb_cold_5();
  }
  pcStack_130 = run_test_random_sync;
  random_cb_cold_6();
  plVar4 = &lStack_340;
  alStack_330[0] = -0x16;
  pcStack_130 = (code *)buflen;
  iVar2 = uv_random(0,0,auStack_230,0x100,0xffffffff,0);
  lStack_340 = (long)iVar2;
  if (alStack_330[0] == lStack_340) {
    alStack_330[0] = -7;
    iVar2 = uv_random(0,0,auStack_230,0xffffffffffffffff,0xffffffff,0);
    lStack_340 = (long)iVar2;
    if (alStack_330[0] != lStack_340) goto LAB_001b84b9;
    memset(auStack_230,0,0x100);
    iVar2 = uv_random(0,0,auStack_230,0x100,0,0);
    alStack_330[0] = (long)iVar2;
    lStack_340 = 0;
    if (alStack_330[0] != 0) goto LAB_001b84c6;
    memset(alStack_330,0,0x100);
    lStack_340 = 0;
    iVar2 = memcmp(auStack_230,alStack_330,0x100);
    lStack_338 = (long)iVar2;
    if (lStack_340 != lStack_338) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      lStack_340 = 0;
      uVar3 = uv_default_loop();
      iVar2 = uv_loop_close(uVar3);
      lStack_338 = (long)iVar2;
      if (lStack_340 == lStack_338) {
        uv_library_shutdown();
        return;
      }
      goto LAB_001b84e0;
    }
  }
  else {
    run_test_random_sync_cold_1();
LAB_001b84b9:
    run_test_random_sync_cold_2();
LAB_001b84c6:
    run_test_random_sync_cold_3();
  }
  run_test_random_sync_cold_5();
LAB_001b84e0:
  run_test_random_sync_cold_4();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return;
  }
  uv_close(plVar4,0);
  return;
}

Assistant:

static void random_cb(uv_random_t* req, int status, void* buf, size_t buflen) {
  char zero[sizeof(scratch)];

  memset(zero, 0, sizeof(zero));

  ASSERT_OK(status);
  ASSERT_PTR_EQ(buf, (void*) scratch);

  if (random_cb_called == 0) {
    ASSERT_OK(buflen);
    ASSERT_OK(memcmp(scratch, zero, sizeof(zero)));
  } else {
    ASSERT_EQ(buflen, sizeof(scratch));
    /* Buy a lottery ticket if you manage to trip this assertion. */
    ASSERT_NE(0, memcmp(scratch, zero, sizeof(zero)));
  }

  random_cb_called++;
}